

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::UniformCase::BasicUniform::BasicUniform
          (BasicUniform *this,char *name_,DataType type_,bool isUsedInShader_,VarValue *finalValue_,
          char *rootName_,int elemNdx_,int rootSize_)

{
  long lVar1;
  VarValue *pVVar2;
  byte bVar3;
  allocator<char> local_32;
  allocator<char> local_31;
  
  bVar3 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_31);
  this->type = type_;
  this->isUsedInShader = isUsedInShader_;
  pVVar2 = &this->finalValue;
  for (lVar1 = 0x11; lVar1 != 0; lVar1 = lVar1 + -1) {
    pVVar2->type = finalValue_->type;
    finalValue_ = (VarValue *)((long)finalValue_ + (ulong)bVar3 * -8 + 4);
    pVVar2 = (VarValue *)((long)pVVar2 + (ulong)bVar3 * -8 + 4);
  }
  if (rootName_ == (char *)0x0) {
    rootName_ = name_;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->rootName,rootName_,&local_32);
  this->elemNdx = elemNdx_;
  this->rootSize = rootSize_;
  return;
}

Assistant:

BasicUniform (const char* const		name_,
					  const glu::DataType	type_,
					  const bool			isUsedInShader_,
					  const VarValue&		finalValue_,
					  const char* const		rootName_	= DE_NULL,
					  const int				elemNdx_	= -1,
					  const int				rootSize_	= 1)
					  : name			(name_)
					  , type			(type_)
					  , isUsedInShader	(isUsedInShader_)
					  , finalValue		(finalValue_)
					  , rootName		(rootName_ == DE_NULL ? name_ : rootName_)
					  , elemNdx			(elemNdx_)
					  , rootSize		(rootSize_)
					 {
					 }